

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

WordEmbedding * __thiscall CoreML::Specification::Model::mutable_wordembedding(Model *this)

{
  bool bVar1;
  WordEmbedding *this_00;
  Model *this_local;
  
  bVar1 = has_wordembedding(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_wordembedding(this);
    this_00 = (WordEmbedding *)operator_new(0x28);
    CoreMLModels::WordEmbedding::WordEmbedding(this_00);
    (this->Type_).wordembedding_ = this_00;
  }
  return (WordEmbedding *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::CoreMLModels::WordEmbedding* Model::mutable_wordembedding() {
  if (!has_wordembedding()) {
    clear_Type();
    set_has_wordembedding();
    Type_.wordembedding_ = new ::CoreML::Specification::CoreMLModels::WordEmbedding;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.wordEmbedding)
  return Type_.wordembedding_;
}